

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_converter_process_pcm_frames
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_format mVar1;
  ma_resampling_backend_vtable *pmVar2;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *p_Var3;
  ma_result mVar4;
  ma_result mVar5;
  ulong uVar6;
  ulong uVar7;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
  *UNRECOVERED_JUMPTABLE;
  ulong uVar8;
  void *pvVar9;
  size_t __n;
  ulong uVar10;
  ulong frameCount;
  undefined1 *puVar11;
  ma_resampling_backend *pmVar12;
  char cVar13;
  ma_uint64 framesProcessed;
  ma_uint64 mVar14;
  ulong *puVar15;
  undefined1 *puVar16;
  ulong *puVar17;
  ma_uint64 mVar18;
  bool bVar19;
  bool bVar20;
  ma_uint64 frameCountInThisIteration;
  ma_uint8 pTempBufferMid [4096];
  ma_uint8 pTempBufferOut [4096];
  ma_uint8 pTempBufferIn [4096];
  ulong local_30a8;
  ma_channel_converter *local_30a0;
  void *local_3098;
  void *local_3090;
  ma_uint64 local_3088;
  ma_uint64 *local_3080;
  ma_uint64 *local_3078;
  ulong local_3070;
  ma_uint64 local_3068;
  ma_uint64 local_3060;
  ma_uint64 local_3058;
  ma_channel_converter *local_3050;
  ma_channel_converter *local_3048;
  ulong local_3040;
  undefined1 local_3038 [4096];
  ulong local_2038 [512];
  undefined1 local_1038 [4104];
  
  mVar4 = MA_INVALID_ARGS;
  if (pConverter == (ma_data_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_3098 = pFramesOut;
  local_3090 = pFramesIn;
  local_3080 = pFrameCountIn;
  local_3078 = pFrameCountOut;
  switch(pConverter->executionPath) {
  case ma_data_converter_execution_path_passthrough:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *pFrameCountOut;
    }
    if (uVar10 < uVar7) {
      uVar7 = uVar10;
    }
    if (pFramesOut == (void *)0x0) goto LAB_00144ba2;
    __n = ((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) * uVar7;
    if (pFramesIn != (void *)0x0) {
      memcpy(pFramesOut,pFramesIn,__n);
      goto LAB_00144ba2;
    }
    break;
  case ma_data_converter_execution_path_format_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *pFrameCountOut;
    }
    if (uVar10 < uVar7) {
      uVar7 = uVar10;
    }
    if (pFramesOut == (void *)0x0) goto LAB_00144ba2;
    if (pFramesIn != (void *)0x0) {
      ma_pcm_convert(pFramesOut,pConverter->formatOut,pFramesIn,pConverter->formatIn,
                     pConverter->channelsIn * uVar7,pConverter->ditherMode);
      goto LAB_00144ba2;
    }
    __n = ((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) * uVar7;
    break;
  case ma_data_converter_execution_path_channels_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *pFrameCountOut;
    }
    if (uVar7 < uVar10) {
      uVar10 = uVar7;
    }
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      mVar4 = ma_channel_converter_process_pcm_frames
                        (&pConverter->channelConverter,pFramesOut,pFramesIn,uVar10);
      if (mVar4 != MA_SUCCESS) {
        return mVar4;
      }
    }
    else {
      local_30a0 = &pConverter->channelConverter;
      uVar7 = 0;
      do {
        uVar8 = uVar10 - uVar7;
        if (uVar10 < uVar7 || uVar8 == 0) break;
        mVar1 = (pConverter->channelConverter).format;
        frameCount = 0x1000 / (ulong)((pConverter->channelConverter).channelsOut *
                                     (&DAT_0017d490)[mVar1]);
        if (local_3090 == (void *)0x0) {
          pvVar9 = (void *)0x0;
        }
        else {
          pvVar9 = (void *)(((&DAT_0017d490)[pConverter->formatIn] * pConverter->channelsIn) * uVar7
                           + (long)local_3090);
        }
        if (local_3098 == (void *)0x0) {
          puVar16 = (undefined1 *)0x0;
        }
        else {
          puVar16 = (undefined1 *)
                    (((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) * uVar7 +
                    (long)local_3098);
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          if (uVar8 < frameCount) {
            frameCount = uVar8;
          }
          mVar4 = ma_channel_converter_process_pcm_frames(local_30a0,local_1038,pvVar9,frameCount);
          if (mVar4 == MA_SUCCESS) goto LAB_001444ce;
          bVar19 = false;
        }
        else {
          uVar6 = 0x1000 / (ulong)((&DAT_0017d490)[mVar1] *
                                  (pConverter->channelConverter).channelsIn);
          if (uVar8 < uVar6) {
            uVar6 = uVar8;
          }
          if (uVar6 < frameCount) {
            frameCount = uVar6;
          }
          if (pConverter->hasPostFormatConversion == '\0') {
            frameCount = uVar6;
          }
          if (pvVar9 == (void *)0x0) {
            memset(local_3038,0,0x1000);
          }
          else {
            ma_pcm_convert(local_3038,mVar1,pvVar9,pConverter->formatIn,
                           pConverter->channelsIn * frameCount,pConverter->ditherMode);
          }
          puVar11 = puVar16;
          if (pConverter->hasPostFormatConversion != '\0') {
            puVar11 = local_1038;
          }
          mVar4 = ma_channel_converter_process_pcm_frames(local_30a0,puVar11,local_3038,frameCount);
          bVar19 = mVar4 == MA_SUCCESS;
          if (bVar19) {
LAB_001444ce:
            if ((pConverter->hasPostFormatConversion != '\0') && (puVar16 != (undefined1 *)0x0)) {
              ma_pcm_convert(puVar16,pConverter->formatOut,local_1038,
                             (pConverter->channelConverter).format,
                             (pConverter->channelConverter).channelsOut * frameCount,
                             pConverter->ditherMode);
            }
            uVar7 = uVar7 + frameCount;
            bVar19 = true;
          }
        }
      } while (bVar19);
    }
    if (local_3080 != (ma_uint64 *)0x0) {
      *local_3080 = uVar10;
    }
    mVar4 = MA_SUCCESS;
    goto LAB_00144b71;
  case ma_data_converter_execution_path_resample_only:
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      if (pFrameCountIn == (ma_uint64 *)0x0 && pFrameCountOut == (ma_uint64 *)0x0) {
        return MA_INVALID_ARGS;
      }
      pmVar2 = (pConverter->resampler).pBackendVTable;
      if (pmVar2 == (ma_resampling_backend_vtable *)0x0) {
        return MA_NOT_IMPLEMENTED;
      }
      UNRECOVERED_JUMPTABLE = pmVar2->onProcess;
      if (UNRECOVERED_JUMPTABLE ==
          (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
           *)0x0) {
        return MA_NOT_IMPLEMENTED;
      }
      mVar4 = (*UNRECOVERED_JUMPTABLE)
                        ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend,
                         pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
      return mVar4;
    }
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_30a0 = (ma_channel_converter *)0x0;
    }
    else {
      local_30a0 = (ma_channel_converter *)*pFrameCountIn;
    }
    mVar4 = MA_SUCCESS;
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      mVar18 = 0;
    }
    else {
      mVar18 = *pFrameCountOut;
    }
    if (mVar18 == 0) {
      mVar14 = 0;
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      mVar14 = 0;
      do {
        mVar1 = (pConverter->resampler).format;
        uVar7 = 0x1000 / (ulong)((&DAT_0017d490)[mVar1] * (pConverter->resampler).channels);
        if (pFramesIn == (void *)0x0) {
          pvVar9 = (void *)0x0;
        }
        else {
          pvVar9 = (void *)(((&DAT_0017d490)[pConverter->formatIn] * pConverter->channelsIn) *
                            mVar14 + (long)pFramesIn);
        }
        if (pFramesOut == (void *)0x0) {
          puVar16 = (undefined1 *)0x0;
        }
        else {
          puVar16 = (undefined1 *)
                    (((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) * uVar10 +
                    (long)pFramesOut);
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          local_2038[0] = (long)local_30a0 - mVar14;
          local_30a8 = mVar18 - uVar10;
          if (uVar7 <= mVar18 - uVar10) {
            local_30a8 = uVar7;
          }
          pmVar2 = (pConverter->resampler).pBackendVTable;
          mVar4 = MA_NOT_IMPLEMENTED;
          if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
             (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
             UNRECOVERED_JUMPTABLE !=
             (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
              *)0x0)) {
            mVar4 = (*UNRECOVERED_JUMPTABLE)
                              ((pConverter->resampler).pBackendUserData,
                               (pConverter->resampler).pBackend,pvVar9,local_2038,local_1038,
                               &local_30a8);
            pFramesOut = local_3098;
            pFramesIn = local_3090;
          }
          bVar20 = mVar4 == MA_SUCCESS;
          mVar5 = MA_SUCCESS;
          bVar19 = false;
        }
        else {
          local_2038[0] = (long)local_30a0 - mVar14;
          if (uVar7 <= (long)local_30a0 - mVar14) {
            local_2038[0] = uVar7;
          }
          if (pvVar9 == (void *)0x0) {
            memset(local_3038,0,0x1000);
          }
          else {
            ma_pcm_convert(local_3038,mVar1,pvVar9,pConverter->formatIn,
                           local_2038[0] * pConverter->channelsIn,pConverter->ditherMode);
          }
          local_30a8 = mVar18 - uVar10;
          if (pConverter->hasPostFormatConversion == '\0') {
            pmVar2 = (pConverter->resampler).pBackendVTable;
            mVar4 = MA_NOT_IMPLEMENTED;
            if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
               (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
               UNRECOVERED_JUMPTABLE !=
               (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
                *)0x0)) {
              pmVar12 = (pConverter->resampler).pBackend;
              pvVar9 = (pConverter->resampler).pBackendUserData;
              puVar11 = puVar16;
              goto LAB_00144ad8;
            }
          }
          else {
            if (uVar7 < local_30a8) {
              local_30a8 = uVar7;
            }
            pmVar2 = (pConverter->resampler).pBackendVTable;
            mVar4 = MA_NOT_IMPLEMENTED;
            if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
               (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
               UNRECOVERED_JUMPTABLE !=
               (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
                *)0x0)) {
              pmVar12 = (pConverter->resampler).pBackend;
              pvVar9 = (pConverter->resampler).pBackendUserData;
              puVar11 = local_1038;
LAB_00144ad8:
              mVar4 = (*UNRECOVERED_JUMPTABLE)
                                (pvVar9,pmVar12,local_3038,local_2038,puVar11,&local_30a8);
            }
          }
          bVar20 = mVar4 == MA_SUCCESS;
          pFramesOut = local_3098;
          pFramesIn = local_3090;
          mVar5 = mVar4;
          bVar19 = bVar20;
        }
        if (bVar20) {
          if ((pConverter->hasPostFormatConversion != '\0') && (puVar16 != (undefined1 *)0x0)) {
            ma_pcm_convert(puVar16,pConverter->formatOut,local_1038,(pConverter->resampler).format,
                           (pConverter->resampler).channels * local_30a8,pConverter->ditherMode);
            pFramesOut = local_3098;
            pFramesIn = local_3090;
          }
          mVar14 = mVar14 + local_2038[0];
          uVar10 = uVar10 + local_30a8;
          bVar19 = local_30a8 != 0;
          mVar4 = mVar5;
        }
      } while ((bVar19) && (uVar10 < mVar18));
    }
    if (local_3080 != (ma_uint64 *)0x0) {
      *local_3080 = mVar14;
    }
LAB_00144b71:
    if (local_3078 == (ulong *)0x0) {
      return mVar4;
    }
    *local_3078 = uVar10;
    return mVar4;
  case ma_data_converter_execution_path_resample_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3060 = 0;
    }
    else {
      local_3060 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3058 = 0;
    }
    else {
      local_3058 = *pFrameCountOut;
    }
    local_30a0 = (ma_channel_converter *)0x0;
    uVar10 = 0x1000 / (ulong)((&DAT_0017d490)[(pConverter->resampler).format] *
                             (pConverter->resampler).channels);
    local_3050 = &pConverter->channelConverter;
    local_3048 = (ma_channel_converter *)
                 (0x1000 / (ulong)((&DAT_0017d490)[(pConverter->channelConverter).format] *
                                  (pConverter->channelConverter).channelsOut));
    local_3070 = 0;
    mVar5 = mVar4;
    do {
      uVar7 = local_3058 - local_3070;
      if (local_3058 < local_3070 || uVar7 == 0) goto LAB_001448c9;
      if (pFramesIn == (void *)0x0) {
        puVar16 = (undefined1 *)0x0;
      }
      else {
        puVar16 = (undefined1 *)
                  ((ulong)((&DAT_0017d490)[pConverter->formatIn] * pConverter->channelsIn) *
                   (long)local_30a0 + (long)pFramesIn);
      }
      if (pFramesOut == (void *)0x0) {
        puVar17 = (ulong *)0x0;
      }
      else {
        puVar17 = (ulong *)(((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) *
                            local_3070 + (long)pFramesOut);
      }
      uVar8 = local_3060 - (long)local_30a0;
      local_30a8 = uVar10;
      if (uVar8 < uVar10) {
        local_30a8 = uVar8;
      }
      if (pConverter->hasPreFormatConversion == '\0') {
        local_30a8 = uVar8;
      }
      if (uVar10 <= uVar7) {
        uVar7 = uVar10;
      }
      local_3088 = (ma_uint64)local_3048;
      if (uVar7 < local_3048) {
        local_3088 = uVar7;
      }
      if (pConverter->hasPostFormatConversion == '\0') {
        local_3088 = uVar7;
      }
      local_3068 = 0;
      pmVar2 = (pConverter->resampler).pBackendVTable;
      if (((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
          (p_Var3 = pmVar2->onGetRequiredInputFrameCount,
          p_Var3 == (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)
                    0x0)) ||
         (mVar4 = (*p_Var3)((pConverter->resampler).pBackendUserData,
                            (pConverter->resampler).pBackend,local_3088,&local_3068),
         pFramesOut = local_3098, pFramesIn = local_3090, mVar4 != MA_SUCCESS)) {
        local_3068 = ((pConverter->resampler).sampleRateIn * local_3088) /
                     (ulong)(pConverter->resampler).sampleRateOut;
      }
      if (local_3068 < local_30a8) {
        local_30a8 = local_3068;
      }
      bVar19 = pConverter->hasPreFormatConversion == '\0';
      puVar11 = (undefined1 *)0x0;
      if (bVar19) {
        puVar11 = puVar16;
      }
      if (!bVar19 && pFramesIn != (void *)0x0) {
        puVar11 = local_1038;
        ma_pcm_convert(puVar11,(pConverter->resampler).format,puVar16,pConverter->formatIn,
                       pConverter->channelsIn * local_30a8,pConverter->ditherMode);
        pFramesOut = local_3098;
        pFramesIn = local_3090;
      }
      pmVar2 = (pConverter->resampler).pBackendVTable;
      mVar4 = MA_NOT_IMPLEMENTED;
      if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
         (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
         UNRECOVERED_JUMPTABLE !=
         (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
          *)0x0)) {
        mVar4 = (*UNRECOVERED_JUMPTABLE)
                          ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend
                           ,puVar11,&local_30a8,local_3038,&local_3088);
        pFramesOut = local_3098;
        pFramesIn = local_3090;
      }
      cVar13 = '\x01';
      if (mVar4 == MA_SUCCESS) {
        if (pFramesOut != (void *)0x0) {
          puVar15 = local_2038;
          if (pConverter->hasPostFormatConversion == '\0') {
            puVar15 = puVar17;
          }
          mVar4 = ma_channel_converter_process_pcm_frames(local_3050,puVar15,local_3038,local_3088);
          pFramesOut = local_3098;
          pFramesIn = local_3090;
          if (mVar4 != MA_SUCCESS) goto LAB_00144339;
          if (pConverter->hasPostFormatConversion != '\0') {
            ma_pcm_convert(puVar17,pConverter->formatOut,puVar15,
                           (pConverter->channelConverter).format,
                           (pConverter->channelConverter).channelsOut * local_3088,
                           pConverter->ditherMode);
            pFramesOut = local_3098;
            pFramesIn = local_3090;
          }
        }
        local_30a0 = (ma_channel_converter *)((long)local_30a0 + local_30a8);
        local_3070 = local_3070 + local_3088;
        cVar13 = (local_3088 == 0) * '\x03';
        mVar4 = mVar5;
      }
LAB_00144339:
      mVar5 = mVar4;
    } while (cVar13 == '\0');
    goto LAB_001448aa;
  case ma_data_converter_execution_path_channels_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3060 = 0;
    }
    else {
      local_3060 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3058 = 0;
    }
    else {
      local_3058 = *pFrameCountOut;
    }
    local_3048 = &pConverter->channelConverter;
    local_3050 = (ma_channel_converter *)
                 (0x1000 / (ulong)((pConverter->channelConverter).channelsIn *
                                  (&DAT_0017d490)[(pConverter->channelConverter).format]));
    local_30a0 = (ma_channel_converter *)0x0;
    uVar10 = 0x1000 / (ulong)((&DAT_0017d490)[(pConverter->channelConverter).format] *
                             (pConverter->channelConverter).channelsOut);
    local_3040 = 0x1000 / (ulong)((&DAT_0017d490)[(pConverter->resampler).format] *
                                 (pConverter->resampler).channels);
    local_3070 = 0;
    do {
      uVar7 = local_3058 - local_3070;
      if (local_3058 < local_3070 || uVar7 == 0) goto LAB_001448c9;
      if (local_3090 == (void *)0x0) {
        puVar16 = (undefined1 *)0x0;
      }
      else {
        puVar16 = (undefined1 *)
                  ((ulong)((&DAT_0017d490)[pConverter->formatIn] * pConverter->channelsIn) *
                   (long)local_30a0 + (long)local_3090);
      }
      if (local_3098 == (void *)0x0) {
        puVar17 = (ulong *)0x0;
      }
      else {
        puVar17 = (ulong *)(((&DAT_0017d490)[pConverter->formatOut] * pConverter->channelsOut) *
                            local_3070 + (long)local_3098);
      }
      if (uVar10 <= uVar7) {
        uVar7 = uVar10;
      }
      local_3088 = local_3040;
      if (uVar7 < local_3040) {
        local_3088 = uVar7;
      }
      if (pConverter->hasPostFormatConversion == '\0') {
        local_3088 = uVar7;
      }
      uVar7 = local_3060 - (long)local_30a0;
      local_30a8 = (ulong)local_3050;
      if (uVar7 < local_3050) {
        local_30a8 = uVar7;
      }
      if (pConverter->hasPreFormatConversion == '\0') {
        local_30a8 = uVar7;
      }
      if (uVar10 <= local_30a8) {
        local_30a8 = uVar10;
      }
      local_3068 = 0;
      pmVar2 = (pConverter->resampler).pBackendVTable;
      if (((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
          (p_Var3 = pmVar2->onGetRequiredInputFrameCount,
          p_Var3 == (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)
                    0x0)) ||
         (mVar5 = (*p_Var3)((pConverter->resampler).pBackendUserData,
                            (pConverter->resampler).pBackend,local_3088,&local_3068),
         mVar5 != MA_SUCCESS)) {
        local_3068 = ((pConverter->resampler).sampleRateIn * local_3088) /
                     (ulong)(pConverter->resampler).sampleRateOut;
      }
      if (local_3068 < local_30a8) {
        local_30a8 = local_3068;
      }
      puVar11 = puVar16;
      if (pConverter->hasPreFormatConversion != '\0') {
        if (puVar16 == (undefined1 *)0x0) {
          puVar11 = (undefined1 *)0x0;
        }
        else {
          puVar11 = local_1038;
          ma_pcm_convert(puVar11,(pConverter->channelConverter).format,puVar16,pConverter->formatIn,
                         pConverter->channelsIn * local_30a8,pConverter->ditherMode);
        }
      }
      mVar5 = ma_channel_converter_process_pcm_frames(local_3048,local_3038,puVar11,local_30a8);
      cVar13 = '\x01';
      if (mVar5 == MA_SUCCESS) {
        puVar15 = local_2038;
        if (pConverter->hasPostFormatConversion == '\0') {
          puVar15 = puVar17;
        }
        pmVar2 = (pConverter->resampler).pBackendVTable;
        mVar5 = MA_NOT_IMPLEMENTED;
        if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
           (UNRECOVERED_JUMPTABLE = pmVar2->onProcess, mVar5 = MA_NOT_IMPLEMENTED,
           UNRECOVERED_JUMPTABLE !=
           (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
            *)0x0)) {
          mVar5 = (*UNRECOVERED_JUMPTABLE)
                            ((pConverter->resampler).pBackendUserData,
                             (pConverter->resampler).pBackend,local_3038,&local_30a8,puVar15,
                             &local_3088);
        }
        if (mVar5 == MA_SUCCESS) {
          if ((pConverter->hasPostFormatConversion != '\0') && (puVar17 != (ulong *)0x0)) {
            ma_pcm_convert(puVar17,pConverter->formatOut,puVar15,(pConverter->resampler).format,
                           pConverter->channelsOut * local_3088,pConverter->ditherMode);
          }
          local_30a0 = (ma_channel_converter *)((long)local_30a0 + local_30a8);
          local_3070 = local_3070 + local_3088;
          cVar13 = (local_3088 == 0) * '\x03';
          mVar5 = mVar4;
        }
      }
      mVar4 = mVar5;
    } while (cVar13 == '\0');
LAB_001448aa:
    if (cVar13 != '\x03') {
      return mVar4;
    }
LAB_001448c9:
    if (local_3080 != (ma_uint64 *)0x0) {
      *local_3080 = (ma_uint64)local_30a0;
    }
    if (local_3078 == (ma_uint64 *)0x0) {
      return MA_SUCCESS;
    }
    *local_3078 = local_3070;
    return MA_SUCCESS;
  default:
    return MA_INVALID_OPERATION;
  }
  if (__n != 0) {
    memset(pFramesOut,0,__n);
  }
LAB_00144ba2:
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = uVar7;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = uVar7;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_data_converter_process_pcm_frames(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    switch (pConverter->executionPath)
    {
        case ma_data_converter_execution_path_passthrough:    return ma_data_converter_process_pcm_frames__passthrough(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_format_only:    return ma_data_converter_process_pcm_frames__format_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_only:  return ma_data_converter_process_pcm_frames__channels_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_only:  return ma_data_converter_process_pcm_frames__resample_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_first: return ma_data_converter_process_pcm_frames__resample_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_first: return ma_data_converter_process_pcm_frames__channels_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        default: return MA_INVALID_OPERATION;   /* Should never hit this. */
    }
}